

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void * __thiscall icu_63::UVector::orphanElementAt(UVector *this,int32_t index)

{
  int local_24;
  void *pvStack_20;
  int32_t i;
  void *e;
  int32_t index_local;
  UVector *this_local;
  
  pvStack_20 = (void *)0x0;
  if ((-1 < index) && (index < this->count)) {
    pvStack_20 = this->elements[index].pointer;
    for (local_24 = index; local_24 < this->count + -1; local_24 = local_24 + 1) {
      this->elements[local_24] = this->elements[local_24 + 1];
    }
    this->count = this->count + -1;
  }
  return pvStack_20;
}

Assistant:

void* UVector::orphanElementAt(int32_t index) {
    void* e = 0;
    if (0 <= index && index < count) {
        e = elements[index].pointer;
        for (int32_t i=index; i<count-1; ++i) {
            elements[i] = elements[i+1];
        }
        --count;
    }
    /* else index out of range */
    return e;
}